

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O0

void Dch_ManResimulateCex(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Aig_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Obj_t *pObj_00;
  abctime aVar5;
  abctime clk;
  int RetValue2;
  int RetValue1;
  int nSize;
  int k;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pRoot;
  Aig_Obj_t *pRepr_local;
  Aig_Obj_t *pObj_local;
  Dch_Man_t *p_local;
  
  pRoot = pRepr;
  pRepr_local = pObj;
  pObj_local = (Aig_Obj_t *)p;
  aVar4 = Abc_Clock();
  Dch_ManCollectTfoCands((Dch_Man_t *)pObj_local,pRepr_local,pRoot);
  *(undefined4 *)&pObj_local[2].pFanin0 = 0;
  Aig_ManIncrementTravId((Aig_Man_t *)pObj_local->pFanin0);
  p_00 = (Aig_Man_t *)pObj_local->pFanin0;
  pObj_00 = Aig_ManConst1((Aig_Man_t *)pObj_local->pFanin0);
  Aig_ObjSetTravIdCurrent(p_00,pObj_00);
  Dch_ManResimulateSolved_rec((Dch_Man_t *)pObj_local,pRepr_local);
  Dch_ManResimulateSolved_rec((Dch_Man_t *)pObj_local,pRoot);
  iVar1 = Abc_MaxInt(*(int *)((long)&pObj_local[2].pFanin0 + 4),*(int *)&pObj_local[2].pFanin0);
  *(int *)((long)&pObj_local[2].pFanin0 + 4) = iVar1;
  for (nSize = 0; iVar1 = nSize, iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj_local[1].field_5.pData),
      iVar1 < iVar2; nSize = nSize + 1) {
    ppClass = (Aig_Obj_t **)Vec_PtrEntry((Vec_Ptr_t *)pObj_local[1].field_5.pData,nSize);
    Dch_ManResimulateOther_rec((Dch_Man_t *)pObj_local,(Aig_Obj_t *)ppClass);
  }
  iVar1 = Dch_ClassesRefineConst1Group
                    (*(Dch_Cla_t **)&pObj_local->field_0x18,(Vec_Ptr_t *)pObj_local[1].field_5.pData
                     ,0);
  clk._4_4_ = 0;
  for (nSize = 0; iVar2 = nSize, iVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj_local[2].field_0.pNext),
      iVar2 < iVar3; nSize = nSize + 1) {
    ppClass = (Aig_Obj_t **)Vec_PtrEntry((Vec_Ptr_t *)pObj_local[2].field_0.pNext,nSize);
    _k = Dch_ClassesReadClass
                   (*(Dch_Cla_t **)&pObj_local->field_0x18,(Aig_Obj_t *)ppClass,&RetValue2);
    for (RetValue1 = 0; RetValue1 < RetValue2; RetValue1 = RetValue1 + 1) {
      Dch_ManResimulateOther_rec((Dch_Man_t *)pObj_local,_k[RetValue1]);
    }
    iVar2 = Dch_ClassesRefineOneClass(*(Dch_Cla_t **)&pObj_local->field_0x18,(Aig_Obj_t *)ppClass,0)
    ;
    clk._4_4_ = iVar2 + clk._4_4_;
  }
  iVar2 = Aig_ObjIsConst1(pRoot);
  if (iVar2 == 0) {
    if (clk._4_4_ == 0) {
      __assert_fail("RetValue2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                    ,0xd2,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  else if (iVar1 == 0) {
    __assert_fail("RetValue1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                  ,0xd0,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  aVar5 = Abc_Clock();
  pObj_local[3].pFanin1 = (Aig_Obj_t *)((aVar5 - aVar4) + (long)pObj_local[3].pFanin1);
  return;
}

Assistant:

void Dch_ManResimulateCex( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // get the equivalence classes
    Dch_ManCollectTfoCands( p, pObj, pRepr );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine these nodes
    RetValue1 = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    // resimulate the cone of influence of the cand classes
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimClasses, pRoot, i )
    {
        ppClass = Dch_ClassesReadClass( p->ppClasses, pRoot, &nSize );
        for ( k = 0; k < nSize; k++ )
            Dch_ManResimulateOther_rec( p, ppClass[k] );
        // refine this class
        RetValue2 += Dch_ClassesRefineOneClass( p->ppClasses, pRoot, 0 );
    }
    // make sure refinement happened
    if ( Aig_ObjIsConst1(pRepr) )
        assert( RetValue1 );
    else
        assert( RetValue2 );
p->timeSimSat += Abc_Clock() - clk;
}